

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLRootParser15.cpp
# Opt level: O0

void __thiscall COLLADASaxFWL::RootParser15::begin__geometry(RootParser15 *this)

{
  geometry__AttributeData *in_stack_00000098;
  RootParser15 *in_stack_000000a0;
  
  begin__geometry(in_stack_000000a0,in_stack_00000098);
  return;
}

Assistant:

bool RootParser15::begin__geometry( const COLLADASaxFWL15::geometry__AttributeData& attributeData )
    {
        SaxVirtualFunctionTest15(begin__geometry(attributeData));
		GeometryLoader* geometryLoader = beginCommonWithId<GeometryLoader, GeometryLoader15>(attributeData.id);
		if ( attributeData.name )
			geometryLoader->setGeometryName (attributeData.name);
		if ( attributeData.id )
			geometryLoader->setGeometryId (attributeData.id);
        return true;
    }